

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

size_t ALIGN_UP(size_t val,size_t alignment)

{
  ulong uVar1;
  char *pcVar2;
  undefined8 uStack_20;
  
  if ((alignment & alignment - 1) == 0) {
    uVar1 = -alignment & (val + alignment) - 1;
    if (val <= uVar1) {
      return uVar1;
    }
    pcVar2 = "result >= val";
    uStack_20 = 0x28;
  }
  else {
    pcVar2 = "0 == (alignment & (alignment - 1))";
    uStack_20 = 0x26;
  }
  fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/include/pal/utils.h"
          ,uStack_20,pcVar2,"");
  fflush(_stderr);
  abort();
}

Assistant:

inline size_t ALIGN_UP(size_t val, size_t alignment)
{
    // alignment must be a power of 2 for this implementation to work (need modulo otherwise)
    _ASSERTE(0 == (alignment & (alignment - 1)));
    size_t result = (val + (alignment - 1)) & ~(alignment - 1);
    _ASSERTE(result >= val);      // check for overflow
    return result;
}